

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

QByteArray * __thiscall
QUrl::toEncoded(QByteArray *__return_storage_ptr__,QUrl *this,FormattingOptions options)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  toString((QString *)&local_30,this,(FormattingOptions)(options.i & 0xf80fffffU | 0x1f00000));
  QString::toLatin1_helper_inplace(__return_storage_ptr__,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QUrl::toEncoded(FormattingOptions options) const
{
    options &= ~(FullyDecoded | FullyEncoded);
    return toString(options | FullyEncoded).toLatin1();
}